

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

void __thiscall Js::ES5Array::MarkVisitKindSpecificPtrs(ES5Array *this,SnapshotExtractor *extractor)

{
  SnapshotExtractor *pSVar1;
  void **ppvVar2;
  void *local_30;
  void *descriptorValidationToken;
  IndexPropertyDescriptor *descriptor;
  uint32 descriptorIndex;
  uint32 length;
  SnapshotExtractor *extractor_local;
  ES5Array *this_local;
  
  _descriptorIndex = extractor;
  extractor_local = (SnapshotExtractor *)this;
  Js::JavascriptArray::MarkVisitKindSpecificPtrs(&this->super_JavascriptArray,extractor);
  descriptor._4_4_ = ArrayObject::GetLength((ArrayObject *)this);
  descriptor._0_4_ = 0xffffffff;
  descriptorValidationToken = (void *)0x0;
  local_30 = (void *)0x0;
  while ((descriptor._0_4_ =
               GetNextDescriptor(this,(uint32)descriptor,
                                 (IndexPropertyDescriptor **)&descriptorValidationToken,&local_30),
         (uint32)descriptor != 0xffffffff && ((uint32)descriptor < descriptor._4_4_))) {
    if ((*descriptorValidationToken & 8) != 8) {
      ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)((long)descriptorValidationToken + 8));
      pSVar1 = _descriptorIndex;
      if (*ppvVar2 != (void *)0x0) {
        ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)((long)descriptorValidationToken + 8));
        TTD::SnapshotExtractor::MarkVisitVar(pSVar1,*ppvVar2);
      }
      ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)((long)descriptorValidationToken + 0x10));
      pSVar1 = _descriptorIndex;
      if (*ppvVar2 != (void *)0x0) {
        ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)((long)descriptorValidationToken + 0x10));
        TTD::SnapshotExtractor::MarkVisitVar(pSVar1,*ppvVar2);
      }
    }
  }
  return;
}

Assistant:

void ES5Array::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        this->JavascriptArray::MarkVisitKindSpecificPtrs(extractor);

        uint32 length = this->GetLength();
        uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
        IndexPropertyDescriptor* descriptor = nullptr;
        void* descriptorValidationToken = nullptr;

        do
        {
            descriptorIndex = this->GetNextDescriptor(descriptorIndex, &descriptor, &descriptorValidationToken);
            if(descriptorIndex == Js::JavascriptArray::InvalidIndex || descriptorIndex >= length)
            {
                break;
            }

            if((descriptor->Attributes & PropertyDeleted) != PropertyDeleted)
            {
                if(descriptor->Getter != nullptr)
                {
                    extractor->MarkVisitVar(descriptor->Getter);
                }

                if(descriptor->Setter != nullptr)
                {
                    extractor->MarkVisitVar(descriptor->Setter);
                }
            }

        } while(true);
    }